

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mzp.cpp
# Opt level: O1

void __thiscall mg::data::Mzp::MzpArchiveEntry::set_data_size(MzpArchiveEntry *this,uint32_t size)

{
  this->size_sectors = ((short)(size >> 0xb) + 1) - (ushort)((size & 0x7ff) == 0);
  this->size_bytes = (uint16_t)size;
  return;
}

Assistant:

void Mzp::MzpArchiveEntry::set_data_size(uint32_t size) {
  // Calculate the number of sectors our data crosses (rounding up)
  const bool crosses_sector = !!(size % SECTOR_SIZE);
  const unsigned sector_bound =
      crosses_sector ? (size / SECTOR_SIZE) + 1 : (size / SECTOR_SIZE);
  size_sectors = sector_bound;
  size_bytes = size & 0xFFFF;
}